

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::Integrator(Integrator *this,SimInfo *info)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  SnapshotManager *this_00;
  Snapshot *pSVar4;
  Globals *pGVar5;
  void *pvVar6;
  undefined8 *puVar7;
  FluctuatingChargeParameters *pFVar8;
  SimInfo *info_00;
  undefined8 uVar9;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  RealType RVar10;
  string prop;
  RealType newET;
  MethodFactory rnemdMethod;
  RNEMDParameters *in_stack_fffffffffffffd28;
  basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>
  *in_stack_fffffffffffffd30;
  SimInfo **in_stack_fffffffffffffd48;
  ForceManager *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  MethodFactory *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  ForceManager *in_stack_fffffffffffffde0;
  SimInfo *in_stack_fffffffffffffe28;
  SPFForceManager *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe48;
  Rattle *in_stack_fffffffffffffe50;
  string local_120 [32];
  locale local_100 [8];
  string local_f8 [32];
  string local_d8 [32];
  double local_b8;
  string local_a8 [64];
  string local_68 [88];
  SimInfo *local_10;
  
  *in_RDI = &PTR__Integrator_004ff3b8;
  in_RDI[0xe] = in_RSI;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  local_10 = in_RSI;
  std::unique_ptr<OpenMD::Velocitizer,std::default_delete<OpenMD::Velocitizer>>::
  unique_ptr<std::default_delete<OpenMD::Velocitizer>,void>
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::unique_ptr<OpenMD::RNEMD::RNEMD,std::default_delete<OpenMD::RNEMD::RNEMD>>::
  unique_ptr<std::default_delete<OpenMD::RNEMD::RNEMD>,void>
            ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  *(undefined1 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)((long)in_RDI + 0xb1) = 0;
  *(undefined1 *)((long)in_RDI + 0xb2) = 0;
  *(undefined1 *)((long)in_RDI + 0xb3) = 0;
  *(undefined1 *)((long)in_RDI + 0xb4) = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  Thermo::Thermo((Thermo *)(in_RDI + 0x1b),(SimInfo *)in_RDI[0xe]);
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0xe]);
  pSVar4 = SnapshotManager::getCurrentSnapshot(this_00);
  in_RDI[0x1c] = pSVar4;
  std::unique_ptr<OpenMD::ProgressBar,std::default_delete<OpenMD::ProgressBar>>::
  unique_ptr<std::default_delete<OpenMD::ProgressBar>,void>
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  in_RDI[0x1e] = 0x3f1a36e2eb1c432d;
  pGVar5 = SimInfo::getSimParams(local_10);
  in_RDI[0xf] = pGVar5;
  bVar1 = Globals::haveDt((Globals *)0x2632aa);
  if (bVar1) {
    RVar10 = Globals::getDt((Globals *)0x2632d1);
    in_RDI[1] = RVar10;
    in_RDI[2] = (double)in_RDI[1] * 0.5;
  }
  else {
    snprintf(painCave.errMsg,2000,"Integrator Error: dt is not set\n");
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveRunTime((Globals *)0x263386);
  if (bVar1) {
    RVar10 = Globals::getRunTime((Globals *)0x2633ad);
    in_RDI[3] = RVar10;
  }
  else {
    snprintf(painCave.errMsg,2000,"Integrator Error: runTime is not set\n");
    painCave.isFatal = 1;
    simError();
  }
  bVar1 = Globals::haveSampleTime((Globals *)0x26341e);
  if (bVar1) {
    RVar10 = Globals::getSampleTime((Globals *)0x263445);
    in_RDI[4] = RVar10;
    in_RDI[5] = in_RDI[4];
  }
  else {
    in_stack_fffffffffffffe50 = (Rattle *)Globals::getRunTime((Globals *)0x263483);
    in_RDI[4] = in_stack_fffffffffffffe50;
    in_RDI[5] = in_RDI[4];
  }
  uVar2 = Globals::haveStatusTime((Globals *)0x2634bf);
  if ((bool)uVar2) {
    RVar10 = Globals::getStatusTime((Globals *)0x2634e6);
    in_RDI[5] = RVar10;
  }
  bVar1 = Globals::haveThermalTime((Globals *)0x263518);
  if (bVar1) {
    in_stack_fffffffffffffe30 = (SPFForceManager *)Globals::getThermalTime((Globals *)0x26353f);
    in_RDI[6] = in_stack_fffffffffffffe30;
  }
  else {
    in_stack_fffffffffffffe28 = (SimInfo *)Globals::getRunTime((Globals *)0x263573);
    in_RDI[6] = in_stack_fffffffffffffe28;
  }
  bVar1 = Globals::getUseInitalTime((Globals *)0x2635a5);
  if (!bVar1) {
    Snapshot::setTime((Snapshot *)in_RDI[0x1c],0.0);
  }
  bVar1 = Globals::haveResetTime((Globals *)0x2635e7);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0xb2) = 1;
    RVar10 = Globals::getResetTime((Globals *)0x263615);
    in_RDI[7] = RVar10;
  }
  *(undefined1 *)((long)in_RDI + 0xb3) = 0;
  bVar1 = Globals::haveTempSet((Globals *)0x26364e);
  if (bVar1) {
    bVar1 = Globals::getTempSet((Globals *)0x263675);
    *(bool *)((long)in_RDI + 0xb3) = bVar1;
  }
  if ((*(byte *)((long)in_RDI + 0xb3) & 1) != 0) {
    bVar1 = Globals::haveTargetTemp((Globals *)0x2636bc);
    if (bVar1) {
      RVar10 = Globals::getTargetTemp((Globals *)0x2636e3);
      in_RDI[0x17] = RVar10;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "Integrator Error: Target Temperature must be set to turn on tempSet\n");
      painCave.isFatal = 1;
      simError();
    }
  }
  std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>(in_stack_fffffffffffffd48);
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator=
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffd30,
             (unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffd28);
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::~unique_ptr
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffd30);
  Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
  bVar1 = RNEMD::RNEMDParameters::haveUseRNEMD((RNEMDParameters *)0x2637b8);
  if (bVar1) {
    in_stack_fffffffffffffde0 = (ForceManager *)Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
    in_stack_fffffffffffffddf = RNEMD::RNEMDParameters::getUseRNEMD((RNEMDParameters *)0x2637f9);
    *(undefined1 *)((long)in_RDI + 0xb4) = in_stack_fffffffffffffddf;
    if ((*(byte *)((long)in_RDI + 0xb4) & 1) != 0) {
      Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
      RNEMD::RNEMDParameters::getMethod_abi_cxx11_(in_stack_fffffffffffffd28);
      Utils::traits_cast<OpenMD::Utils::ci_char_traits,std::char_traits<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd58);
      bVar1 = std::operator==(in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
      std::__cxx11::basic_string<char,_OpenMD::Utils::ci_char_traits,_std::allocator<char>_>::
      ~basic_string(in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_68);
      if (bVar1) {
        pvVar6 = operator_new(0xd68);
        RNEMD::SPFForceManager::SPFForceManager(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
        ;
        in_RDI[0x10] = pvVar6;
      }
      Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
      RNEMD::RNEMDParameters::getMethod_abi_cxx11_(in_stack_fffffffffffffd28);
      RNEMD::MethodFactory::MethodFactory
                ((MethodFactory *)in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
      std::__cxx11::string::~string(local_a8);
      RNEMD::MethodFactory::create
                (in_stack_fffffffffffffd68,
                 (SimInfo *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd58);
      std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator=
                ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
                 in_stack_fffffffffffffd30,
                 (unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
                 in_stack_fffffffffffffd28);
      std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::~unique_ptr
                ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
                 in_stack_fffffffffffffd30);
      Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
      bVar1 = RNEMD::RNEMDParameters::haveExchangeTime((RNEMDParameters *)0x263a36);
      if (bVar1) {
        Globals::getRNEMDParameters((Globals *)in_RDI[0xf]);
        RVar10 = RNEMD::RNEMDParameters::getExchangeTime((RNEMDParameters *)0x263a6b);
        in_RDI[8] = RVar10;
        local_b8 = ceil((double)in_RDI[8] / (double)in_RDI[1]);
        local_b8 = local_b8 * (double)in_RDI[1];
        if (1e-06 < ABS(local_b8 - (double)in_RDI[8])) {
          in_RDI[8] = local_b8;
        }
      }
      RNEMD::MethodFactory::~MethodFactory((MethodFactory *)0x263b45);
    }
  }
  if (in_RDI[0x10] == 0) {
    pvVar6 = operator_new(0xc80);
    ForceManager::ForceManager
              (in_stack_fffffffffffffde0,
               (SimInfo *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    in_RDI[0x10] = pvVar6;
  }
  puVar7 = (undefined8 *)operator_new(8);
  *puVar7 = 0;
  DLM::DLM((DLM *)in_stack_fffffffffffffd30);
  in_RDI[0x11] = puVar7;
  pvVar6 = operator_new(0x68);
  Rattle::Rattle(in_stack_fffffffffffffe50,(SimInfo *)CONCAT17(uVar2,in_stack_fffffffffffffe48));
  in_RDI[0x13] = pvVar6;
  pFVar8 = Globals::getFluctuatingChargeParameters((Globals *)in_RDI[0xf]);
  uVar2 = FluctuatingChargeParameters::havePropagator((FluctuatingChargeParameters *)0x263c45);
  if ((bool)uVar2) {
    info_00 = (SimInfo *)Globals::getFluctuatingChargeParameters((Globals *)in_RDI[0xf]);
    FluctuatingChargeParameters::getPropagator_abi_cxx11_
              ((FluctuatingChargeParameters *)in_stack_fffffffffffffd28);
    std::locale::locale(local_100);
    toUpperCopy<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pFVar8,
               (locale *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
    std::locale::~locale(local_100);
    std::__cxx11::string::~string(local_f8);
    iVar3 = std::__cxx11::string::compare((char *)local_d8);
    if (iVar3 == 0) {
      pvVar6 = operator_new(0x88);
      FluctuatingChargeNVT::FluctuatingChargeNVT
                ((FluctuatingChargeNVT *)CONCAT17(uVar2,in_stack_fffffffffffffd60),info_00);
      in_RDI[0x12] = pvVar6;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_d8);
      if (iVar3 == 0) {
        pvVar6 = operator_new(0x50);
        FluctuatingChargeNVE::FluctuatingChargeNVE
                  ((FluctuatingChargeNVE *)CONCAT17(uVar2,in_stack_fffffffffffffd60),info_00);
        in_RDI[0x12] = pvVar6;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_d8);
        if (iVar3 == 0) {
          pvVar6 = operator_new(0x90);
          FluctuatingChargeLangevin::FluctuatingChargeLangevin
                    ((FluctuatingChargeLangevin *)CONCAT17(uVar2,in_stack_fffffffffffffd60),info_00)
          ;
          in_RDI[0x12] = pvVar6;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_d8);
          if (iVar3 == 0) {
            pvVar6 = operator_new(0x58);
            FluctuatingChargeDamped::FluctuatingChargeDamped
                      ((FluctuatingChargeDamped *)CONCAT17(uVar2,in_stack_fffffffffffffd60),info_00)
            ;
            in_RDI[0x12] = pvVar6;
          }
          else {
            pFVar8 = Globals::getFluctuatingChargeParameters((Globals *)in_RDI[0xf]);
            FluctuatingChargeParameters::getPropagator_abi_cxx11_(pFVar8);
            uVar9 = std::__cxx11::string::c_str();
            snprintf(painCave.errMsg,2000,
                     "Integrator Error: Unknown Fluctuating Charge propagator (%s) requested\n",
                     uVar9);
            std::__cxx11::string::~string(local_120);
            painCave.isFatal = 1;
          }
        }
      }
    }
    std::__cxx11::string::~string(local_d8);
  }
  (**(code **)(*(long *)in_RDI[0x12] + 0x48))((long *)in_RDI[0x12],in_RDI[0x10]);
  return;
}

Assistant:

Integrator::Integrator(SimInfo* info) :
      info_(info), forceMan_(NULL), rotAlgo_(NULL), flucQ_(NULL), rattle_(NULL),
      velocitizer_(nullptr), needPotential(false), needVirial(false),
      needReset(false), needVelocityScaling(false), useRNEMD(false),
      dumpWriter(NULL), statWriter(NULL), thermo(info_),
      snap(info_->getSnapshotManager()->getCurrentSnapshot()) {
    simParams = info->getSimParams();

    if (simParams->haveDt()) {
      dt  = simParams->getDt();
      dt2 = 0.5 * dt;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParams->haveRunTime()) {
      runTime = simParams->getRunTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Integrator Error: runTime is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    // set the status, sample, and thermal kick times
    if (simParams->haveSampleTime()) {
      sampleTime = simParams->getSampleTime();
      statusTime = sampleTime;
    } else {
      sampleTime = simParams->getRunTime();
      statusTime = sampleTime;
    }

    if (simParams->haveStatusTime()) {
      statusTime = simParams->getStatusTime();
    }

    if (simParams->haveThermalTime()) {
      thermalTime = simParams->getThermalTime();
    } else {
      thermalTime = simParams->getRunTime();
    }

    if (!simParams->getUseInitalTime()) { snap->setTime(0.0); }

    if (simParams->haveResetTime()) {
      needReset = true;
      resetTime = simParams->getResetTime();
    }

    // check for the temperature set flag (velocity scaling)
    needVelocityScaling = false;
    if (simParams->haveTempSet()) {
      needVelocityScaling = simParams->getTempSet();
    }

    if (needVelocityScaling) {
      if (simParams->haveTargetTemp()) {
        targetScalingTemp = simParams->getTargetTemp();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Target Temperature must be set to turn on "
                 "tempSet\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    // Create a default a velocitizer: If the subclass wants to use
    // a different velocitizer, use setVelocitizer
    velocitizer_ = std::make_unique<Velocitizer>(info);

    if (simParams->getRNEMDParameters()->haveUseRNEMD()) {
      useRNEMD = simParams->getRNEMDParameters()->getUseRNEMD();

      if (useRNEMD) {
        // ForceManager will only be changed if SPF-RNEMD is enabled
        if (Utils::traits_cast<Utils::ci_char_traits>(
                simParams->getRNEMDParameters()->getMethod()) == "SPF") {
          forceMan_ = new RNEMD::SPFForceManager(info);
        }

        RNEMD::MethodFactory rnemdMethod {
            simParams->getRNEMDParameters()->getMethod()};
        rnemd_ = rnemdMethod.create(info, forceMan_);

        if (simParams->getRNEMDParameters()->haveExchangeTime()) {
          RNEMD_exchangeTime =
              simParams->getRNEMDParameters()->getExchangeTime();

          // check to make sure exchange time is a multiple of dt;
          RealType newET = ceil(RNEMD_exchangeTime / dt) * dt;
          if (std::fabs(newET - RNEMD_exchangeTime) > 1e-6) {
            RNEMD_exchangeTime = newET;
          }
        }
      }
    }

    if (forceMan_ == NULL) forceMan_ = new ForceManager(info);

    rotAlgo_ = new DLM();
    rattle_  = new Rattle(info);

    if (simParams->getFluctuatingChargeParameters()->havePropagator()) {
      std::string prop = toUpperCopy(
          simParams->getFluctuatingChargeParameters()->getPropagator());
      if (prop.compare("NVT") == 0) {
        flucQ_ = new FluctuatingChargeNVT(info);
      } else if (prop.compare("NVE") == 0) {
        flucQ_ = new FluctuatingChargeNVE(info);
      } else if (prop.compare("LANGEVIN") == 0) {
        flucQ_ = new FluctuatingChargeLangevin(info);
      } else if (prop.compare("DAMPED") == 0) {
        flucQ_ = new FluctuatingChargeDamped(info);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Integrator Error: Unknown Fluctuating Charge propagator (%s) "
                 "requested\n",
                 simParams->getFluctuatingChargeParameters()
                     ->getPropagator()
                     .c_str());
        painCave.isFatal = 1;
      }
    }

    flucQ_->setForceManager(forceMan_);
  }